

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

int uv__accept(int sockfd)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  
  if (sockfd < 0) {
    __assert_fail("sockfd >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/core.c"
                  ,0x1d7,"int uv__accept(int)");
  }
LAB_003f729b:
  do {
    if (uv__accept_no_accept4 == '\0') {
      iVar1 = uv__accept4(sockfd,(sockaddr *)0x0,(socklen_t *)0x0,0x80800);
      if (iVar1 != -1) {
        return iVar1;
      }
      piVar3 = __errno_location();
      iVar1 = *piVar3;
      if (iVar1 == 4) goto LAB_003f729b;
      if (iVar1 != 0x26) goto LAB_003f72ed;
      uv__accept_no_accept4 = '\x01';
    }
    iVar1 = accept(sockfd,(sockaddr *)0x0,(socklen_t *)0x0);
    if (iVar1 != -1) {
      iVar2 = uv__cloexec_ioctl(iVar1,1);
      if (iVar2 == 0) {
        iVar2 = uv__nonblock_ioctl(iVar1,1);
      }
      if (iVar2 == 0) {
        return iVar1;
      }
      uv__close(iVar1);
      return iVar2;
    }
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    if (iVar1 != 4) {
LAB_003f72ed:
      return -iVar1;
    }
  } while( true );
}

Assistant:

int uv__accept(int sockfd) {
  int peerfd;
  int err;

  assert(sockfd >= 0);

  while (1) {
#if defined(__linux__)                          || \
    (defined(__FreeBSD__) && __FreeBSD__ >= 10) || \
    defined(__NetBSD__)
    static int no_accept4;

    if (no_accept4)
      goto skip;

    peerfd = uv__accept4(sockfd,
                         NULL,
                         NULL,
                         UV__SOCK_NONBLOCK|UV__SOCK_CLOEXEC);
    if (peerfd != -1)
      return peerfd;

    if (errno == EINTR)
      continue;

    if (errno != ENOSYS)
      return UV__ERR(errno);

    no_accept4 = 1;
skip:
#endif

    peerfd = accept(sockfd, NULL, NULL);
    if (peerfd == -1) {
      if (errno == EINTR)
        continue;
      return UV__ERR(errno);
    }

    err = uv__cloexec(peerfd, 1);
    if (err == 0)
      err = uv__nonblock(peerfd, 1);

    if (err) {
      uv__close(peerfd);
      return err;
    }

    return peerfd;
  }
}